

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O2

vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> * __thiscall
duckdb::UnionByName::UnionCols<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
          (vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *__return_storage_ptr__,
          UnionByName *this,ClientContext *context,vector<duckdb::OpenFileInfo,_true> *files,
          vector<duckdb::LogicalType,_true> *union_col_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *union_col_names,ParquetOptions *options,MultiFileOptions *file_options)

{
  shared_ptr<duckdb::BaseUnionData,_true> *psVar1;
  const_reference args_2;
  BaseUnionData *pBVar2;
  BaseUnionData *pBVar3;
  shared_ptr<duckdb::BaseUnionData,_true> *reader;
  shared_ptr<duckdb::BaseUnionData,_true> *this_00;
  _Head_base<0UL,_duckdb::Task_*,_false> local_f0;
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *__range2;
  Task *local_e0;
  case_insensitive_map_t<idx_t> union_names_map;
  TaskExecutor executor;
  
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ).
  super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __range2 = __return_storage_ptr__;
  ::std::
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ::resize(&__return_storage_ptr__->
            super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ,((long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi -
            (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr) / 0x30);
  TaskExecutor::TaskExecutor(&executor,(ClientContext *)this);
  union_names_map._M_h._M_buckets = (__buckets_ptr)0x0;
  while( true ) {
    if ((__buckets_ptr)
        (((long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi -
         (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal
               .super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr) / 0x30)
        <= union_names_map._M_h._M_buckets) break;
    args_2 = vector<duckdb::OpenFileInfo,_true>::get<true>
                       ((vector<duckdb::OpenFileInfo,_true> *)context,
                        (size_type)union_names_map._M_h._M_buckets);
    make_uniq<duckdb::UnionByReaderTask<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>,duckdb::TaskExecutor&,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,unsigned_long&,duckdb::vector<duckdb::shared_ptr<duckdb::BaseUnionData,true>,true>&,duckdb::ParquetOptions&,duckdb::MultiFileOptions&>
              ((duckdb *)&local_e0,&executor,(ClientContext *)this,args_2,
               (unsigned_long *)&union_names_map,__range2,(ParquetOptions *)union_col_names,
               (MultiFileOptions *)options);
    local_f0._M_head_impl = local_e0;
    local_e0 = (Task *)0x0;
    TaskExecutor::ScheduleTask
              (&executor,
               (unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)&local_f0);
    if (local_f0._M_head_impl != (Task *)0x0) {
      (*(local_f0._M_head_impl)->_vptr_Task[1])();
    }
    local_f0._M_head_impl = (Task *)0x0;
    if (local_e0 != (Task *)0x0) {
      (*local_e0->_vptr_Task[1])();
    }
    union_names_map._M_h._M_buckets = (__buckets_ptr)((long)union_names_map._M_h._M_buckets + 1);
  }
  TaskExecutor::WorkOnTasks(&executor);
  union_names_map._M_h._M_buckets = &union_names_map._M_h._M_single_bucket;
  union_names_map._M_h._M_bucket_count = 1;
  union_names_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  union_names_map._M_h._M_element_count = 0;
  union_names_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  union_names_map._M_h._M_rehash_policy._M_next_resize = 0;
  union_names_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  psVar1 = (__range2->
           super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ).
           super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (__range2->
                 super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                 ).
                 super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != psVar1; this_00 = this_00 + 1
      ) {
    pBVar2 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(this_00);
    pBVar3 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(this_00);
    CombineUnionTypes(&pBVar2->names,&pBVar3->types,(vector<duckdb::LogicalType,_true> *)files,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       *)union_col_types,&union_names_map);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&union_names_map);
  TaskExecutor::~TaskExecutor(&executor);
  return __range2;
}

Assistant:

static vector<shared_ptr<BaseUnionData>>
	UnionCols(ClientContext &context, const vector<OpenFileInfo> &files, vector<LogicalType> &union_col_types,
	          vector<string> &union_col_names, OPTIONS_TYPE &options, MultiFileOptions &file_options) {
		vector<shared_ptr<BaseUnionData>> union_readers;
		union_readers.resize(files.size());

		TaskExecutor executor(context);
		// schedule tasks for all files
		for (idx_t file_idx = 0; file_idx < files.size(); ++file_idx) {
			auto task = make_uniq<UnionByReaderTask<OP, OPTIONS_TYPE>>(executor, context, files[file_idx], file_idx,
			                                                           union_readers, options, file_options);
			executor.ScheduleTask(std::move(task));
		}
		// complete all tasks
		executor.WorkOnTasks();

		// now combine the result schemas
		case_insensitive_map_t<idx_t> union_names_map;
		for (auto &reader : union_readers) {
			auto &col_names = reader->names;
			auto &sql_types = reader->types;
			CombineUnionTypes(col_names, sql_types, union_col_types, union_col_names, union_names_map);
		}
		return union_readers;
	}